

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_19cdc37::ResizeRealtimeTest_TestExternalResizeWorks4Threads_Test::TestBody
          (ResizeRealtimeTest_TestExternalResizeWorks4Threads_Test *this)

{
  EncoderTest *pEVar1;
  undefined8 *puVar2;
  bool bVar3;
  SEARCH_METHODS *pSVar4;
  pointer pFVar5;
  AssertHelper local_b0;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  AssertHelper local_90;
  ResizeRealtimeTest_TestExternalResizeWorks4Threads_Test *local_88;
  pointer local_80;
  uint expected_h;
  uint expected_w;
  ResizingVideoSource video;
  
  ResizingVideoSource::ResizingVideoSource(&video,0x280,0x1e0);
  video.super_DummyVideoSource._44_4_ = 1;
  video.random_input_one_half_only_ = true;
  (this->super_ResizeRealtimeTest).change_bitrate_ = false;
  (this->super_ResizeRealtimeTest).mismatch_psnr_ = 0.0;
  *(undefined8 *)((long)&(this->super_ResizeRealtimeTest).mismatch_psnr_ + 7) = 0;
  ResizeRealtimeTest::DefaultConfig(&this->super_ResizeRealtimeTest);
  (this->super_ResizeRealtimeTest).super_EncoderTest.cfg_.g_forced_max_frame_width = 0x280;
  (this->super_ResizeRealtimeTest).super_EncoderTest.cfg_.g_forced_max_frame_height = 0x1e0;
  (this->super_ResizeRealtimeTest).super_EncoderTest.cfg_.g_threads = 4;
  (this->super_ResizeRealtimeTest).super_EncoderTest.cfg_.kf_min_dist = 0x28;
  (this->super_ResizeRealtimeTest).super_EncoderTest.cfg_.kf_max_dist = 0x28;
  (this->super_ResizeRealtimeTest).super_EncoderTest.cfg_.rc_dropframe_thresh = 0;
  local_88 = this;
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
              (&gtest_fatal_failure_checker);
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      pEVar1 = &(local_88->super_ResizeRealtimeTest).super_EncoderTest;
      (*pEVar1->_vptr_EncoderTest[2])(pEVar1,&video);
    }
    bVar3 = gtest_fatal_failure_checker.has_new_fatal_failure_;
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              (&gtest_fatal_failure_checker);
    if (bVar3 == false) {
      pFVar5 = (local_88->super_ResizeRealtimeTest).frame_info_list_.
               super__Vector_base<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_80 = (local_88->super_ResizeRealtimeTest).frame_info_list_.
                 super__Vector_base<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      if (pFVar5 != local_80) {
        do {
          ScaleForFrameNumber((uint)pFVar5->pts,0x280,0x1e0,video.super_DummyVideoSource._44_4_,
                              false,video.random_input_one_half_only_,&expected_w,&expected_h);
          testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                    ((internal *)&gtest_fatal_failure_checker,"expected_w","info.w",&expected_w,
                     &pFVar5->w);
          if ((char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                    _vptr_TestPartResultReporterInterface == '\0') {
            testing::Message::Message((Message *)&local_b0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(CONCAT44(local_b0.data_._4_4_,local_b0.data_._0_4_) + 0x10),
                       "Frame ",6);
            std::ostream::_M_insert<unsigned_long>
                      (CONCAT44(local_b0.data_._4_4_,local_b0.data_._0_4_) + 0x10);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(CONCAT44(local_b0.data_._4_4_,local_b0.data_._0_4_) + 0x10),
                       " had unexpected width",0x15);
            pSVar4 = "";
            if ((undefined8 *)
                CONCAT71(gtest_fatal_failure_checker._9_7_,
                         gtest_fatal_failure_checker.has_new_fatal_failure_) != (undefined8 *)0x0) {
              pSVar4 = *(SEARCH_METHODS **)
                        CONCAT71(gtest_fatal_failure_checker._9_7_,
                                 gtest_fatal_failure_checker.has_new_fatal_failure_);
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_90,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/resize_test.cc"
                       ,0x330,(char *)pSVar4);
            testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_b0);
            testing::internal::AssertHelper::~AssertHelper(&local_90);
            if ((long *)CONCAT44(local_b0.data_._4_4_,local_b0.data_._0_4_) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT44(local_b0.data_._4_4_,local_b0.data_._0_4_) + 8))();
            }
          }
          puVar2 = (undefined8 *)
                   CONCAT71(gtest_fatal_failure_checker._9_7_,
                            gtest_fatal_failure_checker.has_new_fatal_failure_);
          if (puVar2 != (undefined8 *)0x0) {
            if ((undefined8 *)*puVar2 != puVar2 + 2) {
              operator_delete((undefined8 *)*puVar2);
            }
            operator_delete(puVar2);
          }
          testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                    ((internal *)&gtest_fatal_failure_checker,"expected_h","info.h",&expected_h,
                     &pFVar5->h);
          if ((char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                    _vptr_TestPartResultReporterInterface == '\0') {
            testing::Message::Message((Message *)&local_b0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(CONCAT44(local_b0.data_._4_4_,local_b0.data_._0_4_) + 0x10),
                       "Frame ",6);
            std::ostream::_M_insert<unsigned_long>
                      (CONCAT44(local_b0.data_._4_4_,local_b0.data_._0_4_) + 0x10);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(CONCAT44(local_b0.data_._4_4_,local_b0.data_._0_4_) + 0x10),
                       " had unexpected height",0x16);
            pSVar4 = "";
            if ((undefined8 *)
                CONCAT71(gtest_fatal_failure_checker._9_7_,
                         gtest_fatal_failure_checker.has_new_fatal_failure_) != (undefined8 *)0x0) {
              pSVar4 = *(SEARCH_METHODS **)
                        CONCAT71(gtest_fatal_failure_checker._9_7_,
                                 gtest_fatal_failure_checker.has_new_fatal_failure_);
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_90,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/resize_test.cc"
                       ,0x332,(char *)pSVar4);
            testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_b0);
            testing::internal::AssertHelper::~AssertHelper(&local_90);
            if ((long *)CONCAT44(local_b0.data_._4_4_,local_b0.data_._0_4_) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT44(local_b0.data_._4_4_,local_b0.data_._0_4_) + 8))();
            }
          }
          puVar2 = (undefined8 *)
                   CONCAT71(gtest_fatal_failure_checker._9_7_,
                            gtest_fatal_failure_checker.has_new_fatal_failure_);
          if (puVar2 != (undefined8 *)0x0) {
            if ((undefined8 *)*puVar2 != puVar2 + 2) {
              operator_delete((undefined8 *)*puVar2);
            }
            operator_delete(puVar2);
          }
          local_b0.data_._0_4_ = 0;
          local_90.data_._0_4_ = (local_88->super_ResizeRealtimeTest).mismatch_nframes_;
          testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                    ((internal *)&gtest_fatal_failure_checker,"static_cast<unsigned int>(0)",
                     "GetMismatchFrames()",(uint *)&local_b0,(uint *)&local_90);
          if ((char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                    _vptr_TestPartResultReporterInterface == '\0') {
            testing::Message::Message((Message *)&local_b0);
            pSVar4 = "";
            if ((undefined8 *)
                CONCAT71(gtest_fatal_failure_checker._9_7_,
                         gtest_fatal_failure_checker.has_new_fatal_failure_) != (undefined8 *)0x0) {
              pSVar4 = *(SEARCH_METHODS **)
                        CONCAT71(gtest_fatal_failure_checker._9_7_,
                                 gtest_fatal_failure_checker.has_new_fatal_failure_);
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_90,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/resize_test.cc"
                       ,0x334,(char *)pSVar4);
            testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_b0);
            testing::internal::AssertHelper::~AssertHelper(&local_90);
            if ((long *)CONCAT44(local_b0.data_._4_4_,local_b0.data_._0_4_) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT44(local_b0.data_._4_4_,local_b0.data_._0_4_) + 8))();
            }
          }
          puVar2 = (undefined8 *)
                   CONCAT71(gtest_fatal_failure_checker._9_7_,
                            gtest_fatal_failure_checker.has_new_fatal_failure_);
          if (puVar2 != (undefined8 *)0x0) {
            if ((undefined8 *)*puVar2 != puVar2 + 2) {
              operator_delete((undefined8 *)*puVar2);
            }
            operator_delete(puVar2);
          }
          pFVar5 = pFVar5 + 1;
        } while (pFVar5 != local_80);
      }
      goto LAB_0066f336;
    }
  }
  testing::Message::Message((Message *)&gtest_fatal_failure_checker);
  testing::internal::AssertHelper::AssertHelper
            (&local_b0,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/resize_test.cc"
             ,0x327,
             "Expected: RunLoop(&video) doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
            );
  testing::internal::AssertHelper::operator=(&local_b0,(Message *)&gtest_fatal_failure_checker);
  testing::internal::AssertHelper::~AssertHelper(&local_b0);
  if ((long *)CONCAT71(gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                       _vptr_TestPartResultReporterInterface._1_7_,
                       (char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                             _vptr_TestPartResultReporterInterface) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT71(gtest_fatal_failure_checker.super_TestPartResultReporterInterface
                                   ._vptr_TestPartResultReporterInterface._1_7_,
                                   (char)gtest_fatal_failure_checker.
                                         super_TestPartResultReporterInterface.
                                         _vptr_TestPartResultReporterInterface) + 8))();
  }
LAB_0066f336:
  video.super_DummyVideoSource.super_VideoSource._vptr_VideoSource =
       (_func_int **)&PTR__DummyVideoSource_010306b0;
  aom_img_free(video.super_DummyVideoSource.img_);
  return;
}

Assistant:

TEST_P(ResizeRealtimeTest, TestExternalResizeWorks4Threads) {
  ResizingVideoSource video(640, 480);
  video.flag_codec_ = true;
  video.random_input_one_half_only_ = true;
  change_bitrate_ = false;
  set_scale_mode_ = false;
  set_scale_mode2_ = false;
  set_scale_mode3_ = false;
  mismatch_psnr_ = 0.0;
  mismatch_nframes_ = 0;
  DefaultConfig();
  cfg_.g_forced_max_frame_width = 640;
  cfg_.g_forced_max_frame_height = 480;
  cfg_.g_threads = 4;
  cfg_.kf_max_dist = 40;
  cfg_.kf_min_dist = 40;
  cfg_.rc_dropframe_thresh = 0;
  ASSERT_NO_FATAL_FAILURE(RunLoop(&video));

  for (const auto &info : frame_info_list_) {
    const unsigned int frame = static_cast<unsigned>(info.pts);
    unsigned int expected_w;
    unsigned int expected_h;
    ScaleForFrameNumber(frame, 640, 480, video.flag_codec_, false,
                        video.random_input_one_half_only_, &expected_w,
                        &expected_h);
    EXPECT_EQ(expected_w, info.w)
        << "Frame " << frame << " had unexpected width";
    EXPECT_EQ(expected_h, info.h)
        << "Frame " << frame << " had unexpected height";
    EXPECT_EQ(static_cast<unsigned int>(0), GetMismatchFrames());
  }
}